

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O3

AssemblyCommands * __thiscall
AssemblyCode::PatternMatcher::GenerateCode
          (AssemblyCommands *__return_storage_ptr__,PatternMatcher *this,
          CStatementList *cStatementList)

{
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar1;
  pointer puVar2;
  ulong uVar3;
  CTemp fakeDest;
  CTemp local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = IRT::CStatementList::Statements(cStatementList);
  IRT::CTemp::CTemp(&local_48);
  puVar2 = (pvVar1->
           super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar3 = 0;
    do {
      GenerateCodeForNode(this,(INode *)puVar2[uVar3]._M_t.
                                        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                                        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>.
                                        _M_head_impl,&local_48,__return_storage_ptr__);
      uVar3 = uVar3 + 1;
      puVar2 = (pvVar1->
               super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(pvVar1->
                                   super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
    operator_delete(local_48.name._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

AssemblyCommands AssemblyCode::PatternMatcher::GenerateCode( const IRT::CStatementList *cStatementList ) {
    AssemblyCommands commands;
    const std::vector<std::unique_ptr<const IRT::CStatement>> &statements = cStatementList->Statements( );
    IRT::CTemp fakeDest;
    for ( int index = 0; index < statements.size( ); ++index ) {
        GenerateCodeForNode( statements[ index ].get( ), fakeDest, commands );
    }
    return commands;
}